

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update.c
# Opt level: O0

void gain_condition(CHAR_DATA *ch,int iCond,int value)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  int *piVar4;
  int in_EDX;
  int in_ESI;
  CHAR_DATA *in_RDI;
  __type_conflict2 _Var5;
  int counter;
  int condition;
  undefined1 in_stack_000012e2;
  undefined1 in_stack_000012e3;
  int in_stack_000012e4;
  int in_stack_000012e8;
  int in_stack_000012ec;
  CHAR_DATA *in_stack_000012f0;
  CHAR_DATA *in_stack_000012f8;
  int in_stack_00001318;
  int in_stack_00001320;
  char *in_stack_00001328;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  int in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  char *in_stack_ffffffffffffff80;
  int local_40 [3];
  int local_34 [3];
  int local_28;
  int local_24;
  int local_20 [3];
  int local_14;
  int local_10;
  int local_c;
  CHAR_DATA *local_8;
  
  if (((((in_EDX != 0) &&
        (local_10 = in_EDX, local_c = in_ESI, local_8 = in_RDI,
        bVar2 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)),
        !bVar2)) &&
       (bVar2 = is_immortal((CHAR_DATA *)
                            CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)), !bVar2))
      && ((bVar2 = is_heroimm((CHAR_DATA *)
                              CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)), !bVar2
          && (uVar1 = local_8->act[0], _Var5 = std::pow<int,int>(0,0x63754d),
             (uVar1 & (long)_Var5) == 0)))) &&
     ((local_8->desc != (DESCRIPTOR_DATA *)0x0 &&
      (local_14 = (int)local_8->pcdata->condition[local_c], local_14 != -1)))) {
    local_20[1] = 0;
    local_20[0] = local_14 + local_10;
    piVar4 = std::max<int>(local_20 + 1,local_20);
    local_8->pcdata->condition[local_c] = (short)*piVar4;
    if (local_8->level < 0xb) {
      if ((local_c == 0) && (local_14 != 0)) {
        local_8->pcdata->condition[0] = local_8->pcdata->condition[0] + -1;
      }
      else {
        local_8->pcdata->condition[2] = 0;
        local_8->pcdata->condition[3] = 0;
      }
    }
    else {
      iVar3 = number_percent();
      if (iVar3 < 0x33) {
        if (((local_8->pcdata->condition[local_c] == 0) && (local_c == 2)) &&
           (bVar2 = is_affected(local_8,(int)gsn_accumulate_heat), bVar2)) {
          local_8->pcdata->condition[2] = local_8->pcdata->condition[2] + 1;
        }
      }
      else {
        if ((local_8->pcdata->condition[local_c] == 0) && (local_c == 3)) {
          local_8->pcdata->condition[3] = local_8->pcdata->condition[3] + 1;
        }
        if (((local_8->pcdata->condition[local_c] == 0) && (local_c == 2)) &&
           (bVar2 = is_affected(local_8,(int)gsn_cooling_mist), !bVar2)) {
          local_8->pcdata->condition[2] = local_8->pcdata->condition[2] + 1;
        }
      }
    }
    local_24 = (int)local_8->pcdata->condition[2];
    local_28 = 0x4b;
    piVar4 = std::min<int>(&local_24,&local_28);
    local_8->pcdata->condition[2] = (short)*piVar4;
    local_34[2] = (int)local_8->pcdata->condition[3];
    local_34[1] = 0x4b;
    piVar4 = std::min<int>(local_34 + 2,local_34 + 1);
    local_8->pcdata->condition[3] = (short)*piVar4;
    bVar2 = is_affected(local_8,(int)gsn_aura_of_sustenance);
    if (bVar2) {
      local_8->pcdata->condition[3] = 0;
      local_8->pcdata->condition[2] = 0;
    }
    if (local_c == 0) {
      if (local_8->pcdata->condition[0] == 10) {
        send_to_char(in_stack_ffffffffffffff80,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      }
    }
    else if (local_c == 2) {
      if (0x32 < local_8->pcdata->condition[2]) {
        send_to_char(in_stack_ffffffffffffff80,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      }
    }
    else if ((local_c == 3) && (0x32 < local_8->pcdata->condition[3])) {
      send_to_char(in_stack_ffffffffffffff80,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    }
    if ((0x37 < local_8->pcdata->condition[3]) && (local_c == 3)) {
      local_20[2] = local_8->pcdata->condition[3] + -0x32;
      send_to_char(in_stack_ffffffffffffff80,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      if (10 < local_8->level) {
        local_34[0] = 0x14;
        local_40[2] = number_range(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
        std::min<int>(local_34,local_40 + 2);
        in_stack_ffffffffffffff70 = 0;
        in_stack_ffffffffffffff78 = 1;
        in_stack_ffffffffffffff80 = "hunger";
        damage_new(in_stack_000012f8,in_stack_000012f0,in_stack_000012ec,in_stack_000012e8,
                   in_stack_000012e4,(bool)in_stack_000012e3,(bool)in_stack_000012e2,
                   in_stack_00001318,in_stack_00001320,in_stack_00001328);
      }
    }
    if ((0x37 < local_8->pcdata->condition[2]) && (local_c == 2)) {
      local_20[2] = local_8->pcdata->condition[2] + -0x32;
      send_to_char(in_stack_ffffffffffffff80,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      if (10 < local_8->level) {
        local_40[1] = 0x14;
        local_40[0] = number_range(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
        std::min<int>(local_40 + 1,local_40);
        damage_new(in_stack_000012f8,in_stack_000012f0,in_stack_000012ec,in_stack_000012e8,
                   in_stack_000012e4,(bool)in_stack_000012e3,(bool)in_stack_000012e2,
                   in_stack_00001318,in_stack_00001320,in_stack_00001328);
      }
    }
  }
  return;
}

Assistant:

void gain_condition(CHAR_DATA *ch, int iCond, int value)
{
	int condition;
	int counter;

	if (value == 0 || is_npc(ch) || is_immortal(ch) || is_heroimm(ch) || IS_SET(ch->act, PLR_NOVOID))
		return;

	if (!ch->desc)
		return;

	condition = ch->pcdata->condition[iCond];

	if (condition == -1)
		return;

	ch->pcdata->condition[iCond] = std::max(0, condition + value);

	if (ch->level > 10)
	{
		if (number_percent() > 50)
		{
			if (ch->pcdata->condition[iCond] == 0 && iCond == COND_HUNGER)
				ch->pcdata->condition[COND_HUNGER]++;

			if (ch->pcdata->condition[iCond] == 0 && iCond == COND_THIRST && !is_affected(ch, gsn_cooling_mist))
				ch->pcdata->condition[COND_THIRST]++;
		}
		else if (ch->pcdata->condition[iCond] == 0 && iCond == COND_THIRST && is_affected(ch, gsn_accumulate_heat))
		{
			ch->pcdata->condition[COND_THIRST]++;
		}
	}
	else if (iCond == COND_DRUNK && condition)
	{
		ch->pcdata->condition[COND_DRUNK]--;
	}
	else
	{
		ch->pcdata->condition[COND_THIRST] = 0;
		ch->pcdata->condition[COND_HUNGER] = 0;
	}

	ch->pcdata->condition[COND_THIRST] = std::min((int)ch->pcdata->condition[COND_THIRST], 75);
	ch->pcdata->condition[COND_HUNGER] = std::min((int)ch->pcdata->condition[COND_HUNGER], 75);

	if (is_affected(ch, gsn_aura_of_sustenance))
	{
		ch->pcdata->condition[COND_HUNGER] = 0;
		ch->pcdata->condition[COND_THIRST] = 0;
	}

	switch (iCond)
	{
		case COND_HUNGER:
			if (ch->pcdata->condition[COND_HUNGER] > COND_HUNGRY)
				send_to_char("You are hungry.\n\r", ch);

			break;
		case COND_THIRST:
			if (ch->pcdata->condition[COND_THIRST] > COND_HUNGRY)
				send_to_char("You are thirsty.\n\r", ch);

			break;
		case COND_DRUNK:
			if (ch->pcdata->condition[COND_DRUNK] == 10)
				send_to_char("You are sober.\n\r", ch);

			break;
		default:
			break;
	}

	if (ch->pcdata->condition[COND_HUNGER] > COND_HUNGRY + 5 && iCond == COND_HUNGER)
	{
		counter = ch->pcdata->condition[COND_HUNGER] - COND_HUNGRY;
		send_to_char("You are starving!\n\r", ch);

		if (ch->level > 10)
			damage_new(ch, ch, std::min(20, number_range(counter, 2 * counter)), TYPE_UNDEFINED, DAM_OTHER, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "hunger");
	}

	if (ch->pcdata->condition[COND_THIRST] > COND_HUNGRY + 5 && iCond == COND_THIRST)
	{
		counter = ch->pcdata->condition[COND_THIRST] - COND_HUNGRY;
		send_to_char("You are dying of thirst!\n\r", ch);

		if (ch->level > 10)
			damage_new(ch, ch, std::min(20, number_range(counter, 2 * counter)), TYPE_UNDEFINED, DAM_INTERNAL, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "thirst");
	}
}